

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::CondVar::Remove(CondVar *this,PerThreadSynch *s)

{
  ulong uVar1;
  bool bVar2;
  PerThreadSynch *local_1f8;
  PerThreadSynch *local_c0;
  PerThreadSynch *w;
  PerThreadSynch *h;
  ulong uStack_a8;
  int c;
  intptr_t v;
  PerThreadSynch *pPStack_98;
  ScopedDisable disable_rescheduling;
  PerThreadSynch *s_local;
  CondVar *this_local;
  memory_order __b_2;
  memory_order __b;
  memory_order __b_1;
  
  pPStack_98 = s;
  base_internal::SchedulingGuard::ScopedDisable::ScopedDisable((ScopedDisable *)((long)&v + 7));
  h._4_4_ = 0;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uStack_a8 = *(ulong *)this;
  do {
    if ((uStack_a8 & 1) == 0) {
      LOCK();
      uVar1 = *(ulong *)this;
      if (uStack_a8 == uVar1) {
        *(ulong *)this = uStack_a8 | 1;
      }
      UNLOCK();
      if (uStack_a8 == uVar1) {
        w = (PerThreadSynch *)(uStack_a8 & 0xfffffffffffffffc);
        local_c0 = w;
        if (w != (PerThreadSynch *)0x0) {
          while( true ) {
            bVar2 = false;
            if (local_c0->next != pPStack_98) {
              bVar2 = local_c0->next != w;
            }
            if (!bVar2) break;
            local_c0 = local_c0->next;
          }
          if (local_c0->next == pPStack_98) {
            local_c0->next = pPStack_98->next;
            if (w == pPStack_98) {
              if (local_c0 == pPStack_98) {
                local_1f8 = (PerThreadSynch *)0x0;
              }
              else {
                local_1f8 = local_c0;
              }
              w = local_1f8;
            }
            pPStack_98->next = (PerThreadSynch *)0x0;
            std::atomic<absl::base_internal::PerThreadSynch::State>::store
                      (&pPStack_98->state,kAvailable,memory_order_release);
          }
        }
        std::operator&(memory_order_release,__memory_order_mask);
        *(ulong *)this = (ulong)((uint)uStack_a8 & 2) | (ulong)w;
        base_internal::SchedulingGuard::ScopedDisable::~ScopedDisable
                  ((ScopedDisable *)((long)&v + 7));
        return;
      }
    }
    h._4_4_ = synchronization_internal::MutexDelay(h._4_4_,1);
    std::operator&(memory_order_relaxed,__memory_order_mask);
    uStack_a8 = *(ulong *)this;
  } while( true );
}

Assistant:

void CondVar::Remove(PerThreadSynch* s) {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  intptr_t v;
  int c = 0;
  for (v = cv_.load(std::memory_order_relaxed);;
       v = cv_.load(std::memory_order_relaxed)) {
    if ((v & kCvSpin) == 0 &&  // attempt to acquire spinlock
        cv_.compare_exchange_strong(v, v | kCvSpin, std::memory_order_acquire,
                                    std::memory_order_relaxed)) {
      PerThreadSynch* h = reinterpret_cast<PerThreadSynch*>(v & ~kCvLow);
      if (h != nullptr) {
        PerThreadSynch* w = h;
        while (w->next != s && w->next != h) {  // search for thread
          w = w->next;
        }
        if (w->next == s) {  // found thread; remove it
          w->next = s->next;
          if (h == s) {
            h = (w == s) ? nullptr : w;
          }
          s->next = nullptr;
          s->state.store(PerThreadSynch::kAvailable, std::memory_order_release);
        }
      }
      // release spinlock
      cv_.store((v & kCvEvent) | reinterpret_cast<intptr_t>(h),
                std::memory_order_release);
      return;
    } else {
      // try again after a delay
      c = synchronization_internal::MutexDelay(c, GENTLE);
    }
  }
}